

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O2

void __thiscall
pbrt::ParsedScene::Translate(ParsedScene *this,Float dx,Float dy,Float dz,FileLoc loc)

{
  Transform *pTVar1;
  int i;
  uint i_00;
  Vector3f local_13c;
  Transform local_130;
  Transform local_b0;
  
  if (this->currentApiState == Uninitialized) {
    Error<char_const(&)[10]>
              (&loc,"pbrtInit() must be before calling \"%s()\". Ignoring.",
               (char (*) [10])"Translate");
  }
  else {
    for (i_00 = 0; i_00 != 2; i_00 = i_00 + 1) {
      if ((this->activeTransformBits >> (i_00 & 0x1f) & 1) != 0) {
        pTVar1 = TransformSet::operator[](&this->curTransform,i_00);
        local_13c.super_Tuple3<pbrt::Vector3,_float>.x = dx;
        local_13c.super_Tuple3<pbrt::Vector3,_float>.y = dy;
        local_13c.super_Tuple3<pbrt::Vector3,_float>.z = dz;
        pbrt::Translate(&local_13c);
        pbrt::Transform::operator*(&local_130,pTVar1,&local_b0);
        pTVar1 = TransformSet::operator[](&this->curTransform,i_00);
        *(undefined8 *)(pTVar1->m).m[0] = local_130.m.m[0]._0_8_;
        *(undefined8 *)((pTVar1->m).m[0] + 2) = local_130.m.m[0]._8_8_;
        *(undefined8 *)(pTVar1->m).m[1] = local_130.m.m[1]._0_8_;
        *(undefined8 *)((pTVar1->m).m[1] + 2) = local_130.m.m[1]._8_8_;
        *(undefined8 *)(pTVar1->m).m[2] = local_130.m.m[2]._0_8_;
        *(undefined8 *)((pTVar1->m).m[2] + 2) = local_130.m.m[2]._8_8_;
        *(undefined8 *)(pTVar1->m).m[3] = local_130.m.m[3]._0_8_;
        *(undefined8 *)((pTVar1->m).m[3] + 2) = local_130.m.m[3]._8_8_;
        *(undefined8 *)(pTVar1->mInv).m[0] = local_130.mInv.m[0]._0_8_;
        *(undefined8 *)((pTVar1->mInv).m[0] + 2) = local_130.mInv.m[0]._8_8_;
        *(undefined8 *)(pTVar1->mInv).m[1] = local_130.mInv.m[1]._0_8_;
        *(undefined8 *)((pTVar1->mInv).m[1] + 2) = local_130.mInv.m[1]._8_8_;
        *(undefined8 *)(pTVar1->mInv).m[2] = local_130.mInv.m[2]._0_8_;
        *(undefined8 *)((pTVar1->mInv).m[2] + 2) = local_130.mInv.m[2]._8_8_;
        *(undefined8 *)(pTVar1->mInv).m[3] = local_130.mInv.m[3]._0_8_;
        *(undefined8 *)((pTVar1->mInv).m[3] + 2) = local_130.mInv.m[3]._8_8_;
      }
    }
  }
  return;
}

Assistant:

void ParsedScene::Translate(Float dx, Float dy, Float dz, FileLoc loc) {
    VERIFY_INITIALIZED("Translate");
    FOR_ACTIVE_TRANSFORMS(curTransform[i] =
                              curTransform[i] * pbrt::Translate(Vector3f(dx, dy, dz));)
}